

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.cpp
# Opt level: O2

uint64_t bidfx_public_api::tools::Varint::ReadU64(InputStream *stream)

{
  int iVar1;
  ulong uVar2;
  int offset;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = 0;
  do {
    if (0x3f < uVar3) {
      return uVar2;
    }
    iVar1 = (**stream->_vptr_InputStream)(stream);
    uVar2 = uVar2 | (ulong)((byte)iVar1 & 0x7f) << ((byte)uVar3 & 0x3f);
    uVar3 = uVar3 + 7;
  } while ((char)(byte)iVar1 < '\0');
  return uVar2;
}

Assistant:

uint64_t Varint::ReadU64(InputStream& stream)
{
    unsigned long long result = 0L;
    for (int offset = 0; offset < 64; offset += kBitsPerByte)
    {
        unsigned char next_byte = stream.ReadByte();
        result |= (unsigned long long) (next_byte & kMaskLow7Bits) << offset;
        if (IsFinalByte(next_byte))
        {
            break;
        }
    }
    return result;
}